

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

reference __thiscall
nestl::impl::list_const_iterator<int>::operator*(list_const_iterator<int> *this)

{
  list_node_base *plVar1;
  char *__assertion;
  
  plVar1 = this->m_node;
  if (plVar1 == (list_node_base *)0x0) {
    __assertion = "m_node";
  }
  else if (plVar1->m_prev == (list_node_base *)0x0) {
    __assertion = "(m_node)->m_prev";
  }
  else if (plVar1->m_next == (list_node_base *)0x0) {
    __assertion = "(m_node)->m_next";
  }
  else if (plVar1->m_prev->m_next == plVar1) {
    if (plVar1->m_next->m_prev == plVar1) {
      return (reference)(plVar1 + 1);
    }
    __assertion = "(m_node)->m_next->m_prev == (m_node)";
  }
  else {
    __assertion = "(m_node)->m_prev->m_next == (m_node)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/list.hpp"
                ,0x153,
                "reference nestl::impl::list_const_iterator<int>::operator*() const [T = int]");
}

Assistant:

reference operator*() const NESTL_NOEXCEPT_SPEC
    {
        NESTL_CHECK_LIST_NODE(m_node);
        return static_cast<node_t*>(m_node)->get_reference();
    }